

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

Time __thiscall helics::Federate::requestTimeComplete(Federate *this)

{
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *psVar1;
  TimeRepresentation<count_time<9,_long>_> newTime;
  InvalidFunctionCall *this_00;
  bool bVar2;
  string_view message;
  handle asyncInfo;
  unique_lock<std::mutex> local_28;
  
  LOCK();
  bVar2 = (this->currentMode)._M_i == PENDING_TIME;
  if (bVar2) {
    (this->currentMode)._M_i = EXECUTING;
  }
  UNLOCK();
  if (!bVar2) {
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str =
         "cannot call requestTimeComplete without first calling requestTimeAsync function";
    message._M_len = 0x4f;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  psVar1 = (this->asyncCallInfo)._M_t.
           super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
           .
           super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
           ._M_head_impl;
  local_28._M_device = &psVar1->m_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  newTime = std::future<TimeRepresentation<count_time<9,_long>_>_>::get
                      (&(psVar1->m_obj).timeRequestFuture);
  if (local_28._M_owns == true) {
    std::unique_lock<std::mutex>::unlock(&local_28);
  }
  postTimeRequestOperations(this,(Time)newTime.internalTimeCode,false);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return (Time)newTime.internalTimeCode;
}

Assistant:

Time Federate::requestTimeComplete()
{
    auto exp = Modes::PENDING_TIME;
    if (currentMode.compare_exchange_strong(exp, Modes::EXECUTING)) {
        auto asyncInfo = asyncCallInfo->lock();
        auto newTime = asyncInfo->timeRequestFuture.get();
        asyncInfo.unlock();  // remove the lock;
        postTimeRequestOperations(newTime, false);
        return newTime;
    }
    throw(InvalidFunctionCall(
        "cannot call requestTimeComplete without first calling requestTimeAsync function"));
}